

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_default_vfs_init(ma_default_vfs *pVFS,ma_allocation_callbacks *pAllocationCallbacks)

{
  undefined8 *in_RDI;
  ma_allocation_callbacks *in_stack_00000020;
  ma_allocation_callbacks *in_stack_00000028;
  ma_result local_4;
  
  if (in_RDI == (undefined8 *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    *in_RDI = ma_default_vfs_open;
    in_RDI[1] = ma_default_vfs_open_w;
    in_RDI[2] = ma_default_vfs_close;
    in_RDI[3] = ma_default_vfs_read;
    in_RDI[4] = ma_default_vfs_write;
    in_RDI[5] = ma_default_vfs_seek;
    in_RDI[6] = ma_default_vfs_tell;
    in_RDI[7] = ma_default_vfs_info;
    ma_allocation_callbacks_init_copy(in_stack_00000028,in_stack_00000020);
    local_4 = MA_SUCCESS;
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_default_vfs_init(ma_default_vfs* pVFS, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (pVFS == NULL) {
        return MA_INVALID_ARGS;
    }

    pVFS->cb.onOpen  = ma_default_vfs_open;
    pVFS->cb.onOpenW = ma_default_vfs_open_w;
    pVFS->cb.onClose = ma_default_vfs_close;
    pVFS->cb.onRead  = ma_default_vfs_read;
    pVFS->cb.onWrite = ma_default_vfs_write;
    pVFS->cb.onSeek  = ma_default_vfs_seek;
    pVFS->cb.onTell  = ma_default_vfs_tell;
    pVFS->cb.onInfo  = ma_default_vfs_info;
    ma_allocation_callbacks_init_copy(&pVFS->allocationCallbacks, pAllocationCallbacks);

    return MA_SUCCESS;
}